

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum.c
# Opt level: O2

void aom_get_blk_sse_sum_c(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  ulong uVar1;
  ulong uVar2;
  int j;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  *x_sum = 0;
  *x2_sum = 0;
  uVar1 = 0;
  uVar2 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar2 = uVar1;
  }
  if (bh < 1) {
    bh = 0;
  }
  iVar4 = 0;
  for (iVar5 = 0; iVar5 != bh; iVar5 = iVar5 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar6 = (int)data[uVar3];
      iVar4 = iVar4 + iVar6;
      *x_sum = iVar4;
      uVar1 = uVar1 + (uint)(iVar6 * iVar6);
      *x2_sum = uVar1;
    }
    data = data + stride;
  }
  return;
}

Assistant:

void aom_get_blk_sse_sum_c(const int16_t *data, int stride, int bw, int bh,
                           int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;
  for (int i = 0; i < bh; ++i) {
    for (int j = 0; j < bw; ++j) {
      const int val = data[j];
      *x_sum += val;
      *x2_sum += val * val;
    }
    data += stride;
  }
}